

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O3

void __thiscall wasm::CodeFolding::visitBreak(CodeFolding *this,Break *curr)

{
  pointer *ppTVar1;
  Block *pBVar2;
  size_t sVar3;
  Break *pBVar4;
  iterator __position;
  Expression **ppEVar5;
  mapped_type *this_00;
  Tail local_38;
  
  if ((curr->condition == (Expression *)0x0) && (curr->value == (Expression *)0x0)) {
    ppEVar5 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .controlFlowStack);
    pBVar2 = (Block *)*ppEVar5;
    if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId)
    {
      sVar3 = (pBVar2->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (sVar3 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pBVar4 = (Break *)(pBVar2->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        data[sVar3 - 1];
      if ((pBVar4 == curr) &&
         ((pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id < 2))
      {
        this_00 = std::
                  map<wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
                  ::operator[](&this->breakTails,&curr->name);
        local_38.pointer = (Expression **)0x0;
        local_38.expr = (Expression *)curr;
        local_38.block = pBVar2;
        Tail::validate(&local_38);
        __position._M_current =
             (this_00->
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->
            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
          _M_realloc_insert<wasm::CodeFolding::Tail>(this_00,__position,&local_38);
        }
        else {
          (__position._M_current)->pointer = local_38.pointer;
          (__position._M_current)->expr = local_38.expr;
          (__position._M_current)->block = local_38.block;
          ppTVar1 = &(this_00->
                     super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        return;
      }
    }
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->unoptimizables,&curr->name);
  return;
}

Assistant:

void visitBreak(Break* curr) {
    if (curr->condition || curr->value) {
      unoptimizables.insert(curr->name);
    } else {
      // we can only optimize if we are at the end of the parent block,
      // and if the parent block does not return a value (we can't move
      // elements out of it if there is a value being returned)
      Block* parent = controlFlowStack.back()->dynCast<Block>();
      if (parent && curr == parent->list.back() &&
          !parent->list.back()->type.isConcrete()) {
        breakTails[curr->name].push_back(Tail(curr, parent));
      } else {
        unoptimizables.insert(curr->name);
      }
    }
  }